

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digraph.h
# Opt level: O2

CDAG * degenOrdered(CDAG *__return_storage_ptr__,CGraph *g)

{
  ulong uVar1;
  EdgeIdx *pEVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  VertexIdx i;
  EdgeIdx *pEVar6;
  VertexIdx *pVVar7;
  EdgeIdx *pEVar8;
  VertexIdx *pVVar9;
  void *pvVar10;
  long *__first;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  VertexIdx deg;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  EdgeIdx EVar23;
  ulong uVar24;
  
  uVar1 = g->nVertices;
  uVar18 = -(ulong)(uVar1 + 1 >> 0x3d != 0) | uVar1 * 8 + 8;
  pEVar6 = (EdgeIdx *)operator_new__(uVar18);
  uVar24 = -(ulong)(g->nEdges + 1U >> 0x3d != 0) | g->nEdges * 8 + 8U;
  pVVar7 = (VertexIdx *)operator_new__(uVar24);
  pEVar8 = (EdgeIdx *)operator_new__(uVar18);
  pVVar9 = (VertexIdx *)operator_new__(uVar24);
  uVar24 = -(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8;
  pvVar10 = operator_new__(uVar24);
  __first = (long *)operator_new__(uVar24);
  pvVar11 = operator_new__(uVar24);
  pvVar12 = operator_new__(uVar24);
  pvVar13 = operator_new__(uVar18);
  pvVar14 = operator_new__(uVar1);
  uVar24 = 0;
  uVar18 = 0;
  if (0 < (long)uVar1) {
    uVar18 = uVar1;
  }
  for (; uVar18 != uVar24; uVar24 = uVar24 + 1) {
    __first[uVar24] = uVar24;
    *(undefined1 *)((long)pvVar14 + uVar24) = 0;
    *(EdgeIdx *)((long)pvVar11 + uVar24 * 8) = g->offsets[uVar24 + 1] - g->offsets[uVar24];
  }
  std::__sort<long*,__gnu_cxx::__ops::_Iter_comp_iter<DegreeComp>>
            (__first,__first + uVar1,(_Iter_comp_iter<DegreeComp>)g);
  lVar15 = 0;
  lVar16 = g->nVertices;
  if (g->nVertices < 1) {
    lVar16 = lVar15;
  }
  for (; lVar16 != lVar15; lVar15 = lVar15 + 1) {
    *(long *)((long)pvVar12 + __first[lVar15] * 8) = lVar15;
  }
  pEVar2 = g->offsets;
  lVar15 = pEVar2[*__first];
  lVar20 = pEVar2[*__first + 1];
  for (lVar17 = 0; lVar16 != lVar17; lVar17 = lVar17 + 1) {
    *(undefined8 *)((long)pvVar13 + lVar17 * 8) = 0xffffffffffffffff;
  }
  lVar20 = lVar20 - lVar15;
  *(undefined8 *)((long)pvVar13 + lVar20 * 8) = 0;
  lVar15 = lVar20;
  for (lVar17 = 0; lVar16 != lVar17; lVar17 = lVar17 + 1) {
    lVar19 = pEVar2[__first[lVar17] + 1] - pEVar2[__first[lVar17]];
    if (lVar19 != lVar15) {
      *(long *)((long)pvVar13 + lVar19 * 8) = lVar17;
      lVar15 = lVar19;
    }
  }
  lVar15 = 0;
  do {
    if (lVar15 == lVar16) {
      lVar15 = 0;
      while( true ) {
        if (lVar16 == lVar15) {
          *pEVar6 = 0;
          *pEVar8 = 0;
          lVar17 = 0;
          lVar22 = 0;
          lVar20 = 0;
          lVar19 = 0;
          lVar15 = 0;
          while (lVar15 != lVar16) {
            lVar3 = pEVar2[lVar15 + 1];
            lVar5 = lVar15 + 1;
            for (EVar23 = pEVar2[lVar15]; EVar23 < lVar3; EVar23 = EVar23 + 1) {
              lVar21 = g->nbors[EVar23];
              if (*(long *)((long)pvVar10 + lVar15 * 8) < *(long *)((long)pvVar10 + lVar21 * 8)) {
                pVVar7[lVar22] = lVar21;
                lVar22 = lVar22 + 1;
                lVar19 = lVar19 + 1;
              }
              else {
                pVVar9[lVar17] = lVar21;
                lVar17 = lVar17 + 1;
                lVar20 = lVar20 + 1;
              }
            }
            pEVar6[lVar5] = lVar22;
            pEVar8[lVar5] = lVar17;
            lVar15 = lVar5;
          }
          (__return_storage_ptr__->outlist).nVertices = uVar1;
          (__return_storage_ptr__->outlist).nEdges = lVar19;
          (__return_storage_ptr__->outlist).offsets = pEVar6;
          (__return_storage_ptr__->outlist).nbors = pVVar7;
          (__return_storage_ptr__->inlist).nVertices = uVar1;
          (__return_storage_ptr__->inlist).nEdges = lVar20;
          (__return_storage_ptr__->inlist).offsets = pEVar8;
          (__return_storage_ptr__->inlist).nbors = pVVar9;
          operator_delete__(pvVar10);
          operator_delete__(__first);
          operator_delete__(pvVar11);
          operator_delete__(pvVar12);
          operator_delete__(pvVar13);
          operator_delete__(pvVar14);
          return __return_storage_ptr__;
        }
        if (*(char *)((long)pvVar14 + lVar15) == '\0') break;
        lVar15 = lVar15 + 1;
      }
      printf("Error in degeneracy removal. Vertex %lld not removed\n");
LAB_00103cca:
      exit(1);
    }
    lVar17 = *(long *)((long)pvVar13 + lVar20 * 8);
    lVar19 = __first[lVar17];
    *(long *)((long)pvVar10 + lVar19 * 8) = lVar15;
    __first[lVar17] = -1;
    lVar22 = *(long *)((long)pvVar11 + __first[lVar17 + 1] * 8);
    lVar5 = -1;
    if (lVar22 == *(long *)((long)pvVar11 + lVar19 * 8)) {
      lVar22 = lVar20;
      lVar5 = lVar17 + 1;
    }
    *(undefined1 *)((long)pvVar14 + lVar19) = 1;
    *(long *)((long)pvVar13 + lVar20 * 8) = lVar5;
    for (lVar20 = pEVar2[lVar19]; lVar20 < pEVar2[lVar19 + 1]; lVar20 = lVar20 + 1) {
      lVar17 = g->nbors[lVar20];
      if (*(char *)((long)pvVar14 + lVar17) == '\0') {
        lVar5 = *(long *)((long)pvVar11 + lVar17 * 8);
        lVar3 = *(long *)((long)pvVar13 + lVar5 * 8);
        lVar21 = __first[lVar3];
        if (lVar21 == -1) {
          printf(
                "Error in degeneracy removal. Swapping with removed vertex\n nbr = %lld, deg_ptrs[degrees[nbr]] = %lld"
                );
          goto LAB_00103cca;
        }
        __first[lVar3] = lVar17;
        lVar4 = *(long *)((long)pvVar12 + lVar17 * 8);
        __first[lVar4] = lVar21;
        *(long *)((long)pvVar12 + lVar21 * 8) = lVar4;
        *(long *)((long)pvVar12 + lVar17 * 8) = lVar3;
        lVar21 = lVar3 + 1;
        if (*(long *)((long)pvVar11 + __first[lVar3 + 1] * 8) != lVar5) {
          lVar21 = -1;
        }
        *(long *)((long)pvVar13 + lVar5 * 8) = lVar21;
        lVar21 = lVar5 + -1;
        *(long *)((long)pvVar11 + lVar17 * 8) = lVar21;
        if (*(long *)((long)pvVar13 + lVar5 * 8 + -8) == -1) {
          *(long *)((long)pvVar13 + lVar5 * 8 + -8) = lVar3;
        }
        if (lVar21 <= lVar22) {
          lVar22 = lVar21;
        }
      }
    }
    lVar15 = lVar15 + 1;
    lVar20 = lVar22;
  } while( true );
}

Assistant:

CDAG degenOrdered(CGraph *g) {
    CDAG ret;     // CDAG to be returned
    CGraph outdag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                     new VertexIdx[g->nEdges + 1]};  // Initialize DAG of out-edges
    CGraph indag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                    new VertexIdx[g->nEdges + 1]};   // Initialize DAG of in-edges
    EdgeIdx outcur = 0;
    EdgeIdx incur = 0;
    VertexIdx *removal_time = new VertexIdx[g->nVertices]; // array of removal times
    VertexIdx *verts_by_deg = new VertexIdx[g->nVertices]; // array of vertices, sorted by current degree
    VertexIdx *degrees = new VertexIdx[g->nVertices]; // array of degrees
    VertexIdx *vert_ptrs = new VertexIdx[g->nVertices]; // array of vertex pointers, that point into verts_by_deg
    VertexIdx *deg_ptrs = new VertexIdx[g->nVertices +
                                        1]; // array of degree pointers, pointing into verts_by_deg. deg_ptrs[deg] will point to the first vertex in vert_by_deg with degree deg
    bool *is_removed = new bool[g->nVertices]; // to keep track of whether vertex was removed

    //first, set up a sorted list of vertices by degree
    for (VertexIdx i = 0; i < g->nVertices; i++) // looping over vertices
    {
        verts_by_deg[i] = i; //initializing verts_by_deg to store all vertex labels
        is_removed[i] = false; //intiailizing is_removed to all false
        degrees[i] = g->offsets[i + 1] - g->offsets[i]; // storing the degree of vertex i
    }

    std::sort(verts_by_deg, verts_by_deg + g->nVertices, DegreeComp(g)); // sort all the vertices by degree
    // set up vertex pointers
    for (VertexIdx i = 0; i < g->nVertices; i++) //looping over verts_by_deg
        vert_ptrs[verts_by_deg[i]] = i; // the vertex verts_by_deg[i] is a position i

    //now set up degree pointers
    VertexIdx current_vert = verts_by_deg[0]; //initialize current vertex to smallest degree vertex
    VertexIdx min_deg =
            g->offsets[current_vert + 1] - g->offsets[current_vert]; //initialize running degree to lowest degree
    for (VertexIdx deg = 0; deg < g->nVertices; deg++) //looping over degrees
        deg_ptrs[deg] = -1; // initialize these pointers to -1
    deg_ptrs[min_deg] = 0; // initialize the pointer for minimum degree to beginning on array

    VertexIdx current_deg, running_deg; // we will need this variables while looping
    running_deg = min_deg; //initialize the running degree to the minimum degree
    for (VertexIdx i = 0; i < g->nVertices; i++) //looping over vertices
    {
        current_vert = verts_by_deg[i]; // the ith vertex in sorted list by degree
        current_deg = g->offsets[current_vert + 1] - g->offsets[current_vert]; // get degree of current vertex
        if (current_deg == running_deg) // the current degree is same as running degree, so we move to next vertex
            continue;
        // current_deg is larger, so we need to set pointer in deg_ptrs
        deg_ptrs[current_deg] = i; // the first vertex with current_deg is at location i
        running_deg = current_deg; //update the running degree
    }

    // at this point, we have set up verts_by_deg and deg_ptrs. Now we begin the actual removal of vertices
    VertexIdx to_remove, nbr, swap, next; // convenient variables used in next loop
    for (VertexIdx time = 0;
         time < g->nVertices; time++) // a loop to remove all vertices, with loop variable being the "time"
    {
        to_remove = verts_by_deg[deg_ptrs[min_deg]]; // remove the vertex of minimum degree
        removal_time[to_remove] = time; // set removal time of vertex
        is_removed[to_remove] = true; // remove this vertex

//         printf("Removed %lld, min deg = %lld, position = %lld\n",to_remove,min_deg,deg_ptrs[min_deg]); //(for debug)
//         if (time == g->nVertices-1) // last vertex removed
//             break; // just exit. This is to prevent possible pointer/off-by-1 issues in the remaining code

        next = verts_by_deg[deg_ptrs[min_deg] + 1]; // the next vertex in the current ordering of degree
        verts_by_deg[deg_ptrs[min_deg]] = -1; // remove vertex from array
        if (degrees[next] != degrees[to_remove]) // next has higher degree
        {
            deg_ptrs[min_deg] = -1; // there is no vertex of degree min_deg
            min_deg = degrees[next]; //update minimum degree
        } else //next vertex has same degree, so only need to increment pointer
            deg_ptrs[min_deg]++; // increment degree pointer for minimum degree, since first vertex is removed

        for (VertexIdx j = g->offsets[to_remove];
             j < g->offsets[to_remove + 1]; j++) // loop over neighbors of removed vertex
        {
            nbr = g->nbors[j]; // looking at the neighbor
            if (is_removed[nbr]) // if neighbor is removed, move to next neighbor
                continue;
//             for (VertexIdx ind=0; ind < g->nVertices; ind++) FOR DEBUG
//                 printf("%lld ",verts_by_deg[ind]);
//             printf("Moving %lld from %lld to %lld\n",nbr,vert_ptrs[nbr],deg_ptrs[degrees[nbr]]);

            swap = verts_by_deg[deg_ptrs[degrees[nbr]]]; //vertex to be swapped with nbr
            if (swap == -1) // some problem, swapping with deleted vertex
            {
                printf("Error in degeneracy removal. Swapping with removed vertex\n nbr = %lld, deg_ptrs[degrees[nbr]] = %lld",
                       nbr, deg_ptrs[degrees[nbr]]);
                exit(EXIT_FAILURE);
            }
            verts_by_deg[deg_ptrs[degrees[nbr]]] = nbr; //place nbr at beginning of list of vertices of its degree
            verts_by_deg[vert_ptrs[nbr]] = swap; //place swapped vertex at location of nbr

            vert_ptrs[swap] = vert_ptrs[nbr]; // update position of swapped vertex
            vert_ptrs[nbr] = deg_ptrs[degrees[nbr]]; // update position of nbr

            if (degrees[verts_by_deg[deg_ptrs[degrees[nbr]] + 1]] ==
                degrees[nbr]) // if next vertex in verts_by_deg after nbr has same degree
                deg_ptrs[degrees[nbr]]++; //increment degree pointer for vertices of degree of nbr, since nbr's degree will be decremented
            else // next vertex has higher degree
                deg_ptrs[degrees[nbr]] = -1; // no more vertices of that degree
            degrees[nbr]--; //decrement degree of neighbor
            if (deg_ptrs[degrees[nbr]] == -1) // if there was no vertex with the same degree as nbr
                deg_ptrs[degrees[nbr]] = vert_ptrs[nbr]; // set the degree pointer to current position of nbr

            if (min_deg > degrees[nbr]) // update minimum degree, if needed
                min_deg = degrees[nbr];
        }
    }

    //sanity check; make sure all vertices are removed
    for (VertexIdx i = 0; i < g->nVertices; i++) {
        if (!is_removed[i]) // i was not removed
        {
            printf("Error in degeneracy removal. Vertex %lld not removed\n", i);
            exit(EXIT_FAILURE);
        }
    }

    //now we build the DAG
    outdag.offsets[0] = 0;
    indag.offsets[0] = 0;
    VertexIdx dest;
    outcur = 0;
    incur = 0;

    for (VertexIdx i = 0; i < g->nVertices; ++i)   // Looping over all vertices in g
    {
        for (EdgeIdx j = g->offsets[i]; j < g->offsets[i + 1]; ++j)   // Looping over neighbors of i in g
        {
            dest = g->nbors[j];     // We are now looking at edge (i,dest)

            //We now orient the edge depending of removal times
            // In the output, the g-edge (i,dest) is either pointing to dest (in if condition) or pointing to i (in else condition).

            if (removal_time[i] < removal_time[dest]) // i was removed before dest
            {
                outdag.nbors[outcur] = dest;   // We want point edge from i to dest. So this directed edge is added to outdag.
                ++outcur;                      // Increment pointer in outdag.nbors and the number of edges in outdag.
                ++outdag.nEdges;
            } else {
                indag.nbors[incur] = dest;     // We point edge from dest to i. So this edge goes into indag.
                ++incur;                       // Pointer and number of edges incremented
                ++indag.nEdges;
            }
        }
        outdag.offsets[i +
                       1] = outcur;         // We have finished all edges incident to i, so we can update offsets in DAGs.
        indag.offsets[i + 1] = incur;
    }

    ret.outlist = outdag;
    ret.inlist = indag;

    // free memory
    delete[] removal_time;
    delete[] verts_by_deg;
    delete[] degrees;
    delete[] vert_ptrs;
    delete[] deg_ptrs;
    delete[] is_removed;

    return ret;
}